

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O2

string * __thiscall
antlr::RecognitionException::getFileLineColumnString_abi_cxx11_
          (string *__return_storage_ptr__,RecognitionException *this)

{
  int rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->fileName)._M_string_length != 0) {
    std::operator+(&bStack_58,&this->fileName,":");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  rhs = this->line;
  if (rhs != -1) {
    if ((this->fileName)._M_string_length == 0) {
      std::operator+(&bStack_58,__return_storage_ptr__,"line ");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
      std::__cxx11::string::~string((string *)&bStack_58);
      rhs = this->line;
    }
    antlr::operator+(&bStack_58,__return_storage_ptr__,rhs);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    if (this->column != -1) {
      std::operator+(&local_38,__return_storage_ptr__,":");
      antlr::operator+(&bStack_58,&local_38,this->column);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
      std::__cxx11::string::~string((string *)&bStack_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::operator+(&bStack_58,__return_storage_ptr__,":");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  std::operator+(&bStack_58,__return_storage_ptr__," ");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  return __return_storage_ptr__;
}

Assistant:

string RecognitionException::getFileLineColumnString() const
{
	ANTLR_USE_NAMESPACE(std)string fileLineColumnString;

	if ( fileName.length() > 0 )
		fileLineColumnString = fileName + ":";

	if ( line != -1 )
	{
		if ( fileName.length() == 0 )
			fileLineColumnString = fileLineColumnString + "line ";

		fileLineColumnString = fileLineColumnString + line;

		if ( column != -1 )
			fileLineColumnString = fileLineColumnString + ":" + column;

		fileLineColumnString = fileLineColumnString + ":";
	}

	fileLineColumnString = fileLineColumnString + " ";

	return fileLineColumnString;
}